

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlNodeParseContentInternal
              (xmlDoc *doc,xmlNodePtr parent,xmlChar *value,int len,xmlNodePtr *listPtr)

{
  xmlNodePtr pxVar1;
  int iVar2;
  int iVar3;
  xmlBufPtr buf_00;
  xmlEntityPtr parent_00;
  xmlNodePtr pxVar4;
  xmlChar *pxVar5;
  bool bVar6;
  xmlChar local_96 [2];
  int l;
  xmlChar buffer [10];
  int res;
  int tmp_1;
  int tmp;
  int charval;
  int remaining;
  xmlBufPtr buf;
  xmlEntityPtr ent;
  xmlChar *q;
  xmlChar *cur;
  xmlChar *val;
  xmlNodePtr node;
  xmlNodePtr last;
  xmlNodePtr head;
  xmlNodePtr *listPtr_local;
  int len_local;
  xmlChar *value_local;
  xmlNodePtr parent_local;
  xmlDoc *doc_local;
  
  last = (xmlNodePtr)0x0;
  node = (xmlNodePtr)0x0;
  if (listPtr != (xmlNodePtr *)0x0) {
    *listPtr = (xmlNodePtr)0x0;
  }
  tmp = len;
  if (len < 0) {
    tmp = 0x7fffffff;
  }
  if ((value == (xmlChar *)0x0) || (*value == '\0')) {
LAB_001654cb:
    if (parent != (xmlNodePtr)0x0) {
      if (parent->children != (_xmlNode *)0x0) {
        xmlFreeNodeList(parent->children);
      }
      parent->children = last;
      parent->last = node;
    }
    if (listPtr != (xmlNodePtr *)0x0) {
      *listPtr = last;
    }
    return 0;
  }
  buf_00 = xmlBufCreate(0x32);
  ent = (xmlEntityPtr)value;
  q = value;
  if (buf_00 == (xmlBufPtr)0x0) {
    return -1;
  }
LAB_00164de6:
  cur = (xmlChar *)0x0;
  bVar6 = false;
  if (0 < tmp) {
    bVar6 = *q != '\0';
  }
  if (!bVar6) {
LAB_001653dc:
    if (((xmlEntityPtr)q != ent) &&
       (iVar3 = xmlBufAdd(buf_00,(xmlChar *)ent,(long)q - (long)ent), iVar3 != 0))
    goto LAB_0016551d;
    iVar3 = xmlBufIsEmpty(buf_00);
    if (iVar3 == 0) {
      pxVar4 = xmlNewDocText(doc,(xmlChar *)0x0);
      if (pxVar4 == (xmlNodePtr)0x0) goto LAB_0016551d;
      pxVar4->parent = parent;
      pxVar5 = xmlBufDetach(buf_00);
      pxVar4->content = pxVar5;
      pxVar1 = pxVar4;
      if (node != (xmlNodePtr)0x0) {
        node->next = pxVar4;
        pxVar4->prev = node;
        pxVar1 = last;
      }
    }
    else {
      pxVar4 = node;
      pxVar1 = last;
      if (last == (xmlNodePtr)0x0) {
        pxVar4 = xmlNewDocText(doc,"");
        if (pxVar4 == (xmlNodePtr)0x0) {
          last = (xmlNodePtr)0x0;
          goto LAB_0016551d;
        }
        pxVar4->parent = parent;
        pxVar1 = pxVar4;
      }
    }
    last = pxVar1;
    node = pxVar4;
    xmlBufFree(buf_00);
    goto LAB_001654cb;
  }
  if (*q != '&') {
    q = q + 1;
    tmp = tmp + -1;
    goto LAB_00164de6;
  }
  tmp_1 = 0;
  if (((xmlEntityPtr)q != ent) &&
     (iVar3 = xmlBufAdd(buf_00,(xmlChar *)ent,(long)q - (long)ent), iVar3 != 0)) goto LAB_0016551d;
  if ((2 < tmp) && ((q[1] == '#' && (q[2] == 'x')))) {
    res = 0;
    q = q + 3;
    tmp = tmp + -3;
    do {
      bVar6 = false;
      if (0 < tmp) {
        res = (int)*q;
        bVar6 = res != 0x3b;
      }
      if (!bVar6) goto LAB_00164f76;
      if (((uint)res < 0x30) || (0x39 < (uint)res)) {
        if (((uint)res < 0x61) || (0x66 < (uint)res)) {
          if (((uint)res < 0x41) || (0x46 < (uint)res)) goto LAB_00164f3f;
          tmp_1 = tmp_1 * 0x10 + res + -0x37;
        }
        else {
          tmp_1 = tmp_1 * 0x10 + res + -0x57;
        }
      }
      else {
        tmp_1 = tmp_1 * 0x10 + res + -0x30;
      }
      if (0x110000 < tmp_1) {
        tmp_1 = 0x110000;
      }
      q = q + 1;
      tmp = tmp + -1;
    } while( true );
  }
  if ((1 < tmp) && (q[1] == '#')) {
    buffer[6] = '\0';
    buffer[7] = '\0';
    buffer[8] = '\0';
    buffer[9] = '\0';
    q = q + 2;
    tmp = tmp + -2;
    while( true ) {
      bVar6 = false;
      if (0 < tmp) {
        buffer._6_4_ = ZEXT14(*q);
        bVar6 = buffer._6_4_ != 0x3b;
      }
      if (!bVar6) goto LAB_00165052;
      if (((uint)buffer._6_4_ < 0x30) || (0x39 < (uint)buffer._6_4_)) break;
      tmp_1 = tmp_1 * 10 + buffer._6_4_ + -0x30;
      if (0x110000 < tmp_1) {
        tmp_1 = 0x110000;
      }
      q = q + 1;
      tmp = tmp + -1;
    }
    tmp_1 = 0;
LAB_00165052:
    if (buffer._6_4_ == 0x3b) {
      q = q + 1;
      tmp = tmp + -1;
    }
    goto LAB_0016536a;
  }
  ent = (xmlEntityPtr)(q + 1);
  q = (xmlChar *)ent;
  iVar3 = tmp;
  while( true ) {
    tmp = iVar3 + -1;
    bVar6 = false;
    if ((0 < tmp) && (bVar6 = false, *q != '\0')) {
      bVar6 = *q != ';';
    }
    if (!bVar6) break;
    q = q + 1;
    iVar3 = tmp;
  }
  if ((tmp < 1) || (*q == '\0')) goto LAB_001653dc;
  if ((xmlEntityPtr)q != ent) {
    cur = xmlStrndup((xmlChar *)ent,(int)q - (int)ent);
    if (cur == (xmlChar *)0x0) goto LAB_0016551d;
    parent_00 = xmlGetDocEntity(doc,cur);
    if ((parent_00 == (xmlEntityPtr)0x0) || (parent_00->etype != XML_INTERNAL_PREDEFINED_ENTITY)) {
      iVar2 = xmlBufIsEmpty(buf_00);
      pxVar4 = node;
      pxVar1 = last;
      if (iVar2 == 0) {
        pxVar4 = xmlNewDocText(doc,(xmlChar *)0x0);
        if (pxVar4 == (xmlNodePtr)0x0) goto LAB_0016551d;
        pxVar5 = xmlBufDetach(buf_00);
        pxVar4->content = pxVar5;
        pxVar4->parent = parent;
        pxVar1 = pxVar4;
        if (node != (xmlNodePtr)0x0) {
          node->next = pxVar4;
          pxVar4->prev = node;
          pxVar1 = last;
        }
      }
      last = pxVar1;
      node = pxVar4;
      if ((((parent_00 != (xmlEntityPtr)0x0) && ((parent_00->flags & 1U) == 0)) &&
          ((parent_00->flags & 8U) == 0)) && (parent_00->content != (xmlChar *)0x0)) {
        parent_00->flags = parent_00->flags | 8;
        buffer._2_4_ = xmlNodeParseContentInternal
                                 (doc,(xmlNodePtr)parent_00,parent_00->content,-1,(xmlNodePtr *)0x0)
        ;
        parent_00->flags = parent_00->flags & 0xfffffff7;
        if ((int)buffer._2_4_ < 0) goto LAB_0016551d;
        parent_00->flags = parent_00->flags | 1;
      }
      pxVar4 = xmlNewEntityRef(doc,cur);
      cur = (xmlChar *)0x0;
      if (pxVar4 == (xmlNodePtr)0x0) goto LAB_0016551d;
      pxVar4->parent = parent;
      pxVar4->last = (_xmlNode *)parent_00;
      if (parent_00 != (xmlEntityPtr)0x0) {
        pxVar4->children = (_xmlNode *)parent_00;
        pxVar4->content = parent_00->content;
      }
      pxVar1 = pxVar4;
      if (node != (xmlNodePtr)0x0) {
        node->next = pxVar4;
        pxVar4->prev = node;
        pxVar1 = last;
      }
    }
    else {
      iVar2 = xmlBufCat(buf_00,parent_00->content);
      pxVar4 = node;
      pxVar1 = last;
      if (iVar2 != 0) goto LAB_0016551d;
    }
    last = pxVar1;
    node = pxVar4;
    (*xmlFree)(cur);
  }
  q = q + 1;
  tmp = iVar3 + -2;
LAB_0016536a:
  cur = (xmlChar *)0x0;
  ent = (xmlEntityPtr)q;
  if (tmp_1 != 0) {
    if (0x10ffff < tmp_1) {
      tmp_1 = 0xfffd;
    }
    iVar3 = xmlCopyCharMultiByte(local_96,tmp_1);
    local_96[iVar3] = '\0';
    iVar3 = xmlBufCat(buf_00,local_96);
    if (iVar3 != 0) {
LAB_0016551d:
      xmlBufFree(buf_00);
      if (cur != (xmlChar *)0x0) {
        (*xmlFree)(cur);
      }
      if (last != (xmlNodePtr)0x0) {
        xmlFreeNodeList(last);
      }
      return -1;
    }
  }
  goto LAB_00164de6;
LAB_00164f3f:
  tmp_1 = 0;
LAB_00164f76:
  if (res == 0x3b) {
    q = q + 1;
    tmp = tmp + -1;
  }
  goto LAB_0016536a;
}

Assistant:

static int
xmlNodeParseContentInternal(const xmlDoc *doc, xmlNodePtr parent,
                            const xmlChar *value, int len,
                            xmlNodePtr *listPtr) {
    xmlNodePtr head = NULL, last = NULL;
    xmlNodePtr node;
    xmlChar *val = NULL;
    const xmlChar *cur;
    const xmlChar *q;
    xmlEntityPtr ent;
    xmlBufPtr buf;
    int remaining;

    if (listPtr != NULL)
        *listPtr = NULL;

    if (len < 0)
        remaining = INT_MAX;
    else
        remaining = len;

    if ((value == NULL) || (value[0] == 0))
        goto done;

    cur = value;

    buf = xmlBufCreate(50);
    if (buf == NULL)
        return(-1);

    q = cur;
    while ((remaining > 0) && (*cur != 0)) {
	if (cur[0] == '&') {
	    int charval = 0;

	    /*
	     * Save the current text.
	     */
            if (cur != q) {
		if (xmlBufAdd(buf, q, cur - q))
		    goto out;
	        q = cur;
	    }

	    if ((remaining > 2) && (cur[1] == '#') && (cur[2] == 'x')) {
	        int tmp = 0;

		cur += 3;
                remaining -= 3;
		while ((remaining > 0) && ((tmp = *cur) != ';')) {
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 16 + (tmp - '0');
		    else if ((tmp >= 'a') && (tmp <= 'f'))
			charval = charval * 16 + (tmp - 'a') + 10;
		    else if ((tmp >= 'A') && (tmp <= 'F'))
			charval = charval * 16 + (tmp - 'A') + 10;
		    else {
			charval = 0;
			break;
		    }
                    if (charval > 0x110000)
                        charval = 0x110000;
		    cur++;
                    remaining--;
		}
		if (tmp == ';') {
		    cur++;
                    remaining--;
                }
		q = cur;
	    } else if ((remaining > 1) && (cur[1] == '#')) {
	        int tmp = 0;

		cur += 2;
                remaining -= 2;
		while ((remaining > 0) && ((tmp = *cur) != ';')) {
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 10 + (tmp - '0');
		    else {
			charval = 0;
			break;
		    }
                    if (charval > 0x110000)
                        charval = 0x110000;
		    cur++;
                    remaining--;
		}
		if (tmp == ';') {
		    cur++;
                    remaining--;
                }
		q = cur;
	    } else {
		/*
		 * Read the entity string
		 */
		cur++;
                remaining--;
		q = cur;
		while ((remaining > 0) && (*cur != 0) && (*cur != ';')) {
                    cur++;
                    remaining--;
                }
		if ((remaining <= 0) || (*cur == 0))
		    break;
		if (cur != q) {
		    val = xmlStrndup(q, cur - q);
                    if (val == NULL)
                        goto out;
		    ent = xmlGetDocEntity(doc, val);
		    if ((ent != NULL) &&
			(ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {
                        /*
                         * Predefined entities don't generate nodes
                         */
			if (xmlBufCat(buf, ent->content))
			    goto out;
		    } else {
			/*
			 * Flush buffer so far
			 */
			if (!xmlBufIsEmpty(buf)) {
			    node = xmlNewDocText(doc, NULL);
			    if (node == NULL)
				goto out;
			    node->content = xmlBufDetach(buf);
                            node->parent = parent;

			    if (last == NULL) {
				head = node;
			    } else {
                                last->next = node;
                                node->prev = last;
			    }
                            last = node;
			}

			if ((ent != NULL) &&
                            ((ent->flags & XML_ENT_PARSED) == 0) &&
                            ((ent->flags & XML_ENT_EXPANDING) == 0) &&
                            (ent->content != NULL)) {
                            int res;

                            ent->flags |= XML_ENT_EXPANDING;
                            res = xmlNodeParseContentInternal(doc,
                                    (xmlNodePtr) ent, ent->content, -1, NULL);
                            ent->flags &= ~XML_ENT_EXPANDING;
                            if (res < 0)
                                goto out;
                            ent->flags |= XML_ENT_PARSED;
			}

			/*
			 * Create a new REFERENCE_REF node
			 */
			node = xmlNewEntityRef((xmlDocPtr) doc, val);
                        val = NULL;
			if (node == NULL)
			    goto out;
                        node->parent = parent;
                        node->last = (xmlNodePtr) ent;
                        if (ent != NULL) {
                            node->children = (xmlNodePtr) ent;
                            node->content = ent->content;
                        }

			if (last == NULL) {
			    head = node;
			} else {
                            last->next = node;
                            node->prev = last;
			}
                        last = node;
		    }
		    xmlFree(val);
                    val = NULL;
		}
		cur++;
                remaining--;
		q = cur;
	    }
	    if (charval != 0) {
		xmlChar buffer[10];
		int l;

                if (charval >= 0x110000)
                    charval = 0xFFFD; /* replacement character */

		l = xmlCopyCharMultiByte(buffer, charval);
		buffer[l] = 0;

		if (xmlBufCat(buf, buffer))
		    goto out;
	    }
	} else {
	    cur++;
            remaining--;
        }
    }

    if (cur != q) {
        /*
	 * Handle the last piece of text.
	 */
	if (xmlBufAdd(buf, q, cur - q))
	    goto out;
    }

    if (!xmlBufIsEmpty(buf)) {
	node = xmlNewDocText(doc, NULL);
	if (node == NULL)
            goto out;
        node->parent = parent;
	node->content = xmlBufDetach(buf);

	if (last == NULL) {
	    head = node;
	} else {
            last->next = node;
            node->prev = last;
	}
        last = node;
    } else if (head == NULL) {
        head = xmlNewDocText(doc, BAD_CAST "");
        if (head == NULL)
            goto out;
        head->parent = parent;
        last = head;
    }

    xmlBufFree(buf);

done:
    if (parent != NULL) {
        if (parent->children != NULL)
            xmlFreeNodeList(parent->children);
        parent->children = head;
        parent->last = last;
    }

    if (listPtr != NULL)
        *listPtr = head;

    return(0);

out:
    xmlBufFree(buf);
    if (val != NULL)
        xmlFree(val);
    if (head != NULL)
        xmlFreeNodeList(head);
    return(-1);
}